

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzdohrstructmatrix.cpp
# Opt level: O0

int __thiscall
TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_>::ClusterIslands
          (TPZDohrStructMatrix<double,_TPZStructMatrixOR<double>_> *this,TPZVec<int> *domain_index,
          int nsub,int connectdimension)

{
  int iVar1;
  int iVar2;
  TPZVec<int> *pTVar3;
  bool bVar4;
  int iVar5;
  TPZCompEl **ppTVar6;
  int64_t iVar7;
  int *piVar8;
  mapped_type_conflict4 *pmVar9;
  TPZCompElSide *celside_00;
  size_type sVar10;
  reference piVar11;
  pointer ppVar12;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> *this_00;
  int in_ECX;
  int in_EDX;
  TPZVec<int> *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  int d;
  int domsize;
  int domainshrinkcount;
  int destdomainindexcount;
  int domaintargetindex;
  iterator it;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> sizeDomain;
  int target;
  int64_t count;
  TPZManVector<int,_10> domain_dest;
  int isub;
  int celdomain;
  TPZGeoEl *gelloc;
  TPZCompEl *celloc;
  TPZCompElSide celside;
  int64_t nneighvalid;
  int64_t neigh;
  int64_t nneigh;
  TPZStack<TPZCompElSide,_10> elsidevec;
  TPZGeoElSide gelside;
  int sidedim;
  int is;
  int geldim;
  int nsides;
  TPZGeoEl *gel;
  int mydomainindex;
  TPZCompEl *cel;
  int64_t iel;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> domain_index_count;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> domain_neighbours;
  int64_t mincount;
  int64_t nel;
  int meshdim;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  TPZGeoEl *in_stack_fffffffffffffb08;
  TPZGeoElSide *in_stack_fffffffffffffb10;
  value_type_conflict4 *in_stack_fffffffffffffb18;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  TPZManVector<int,_10> *in_stack_fffffffffffffb30;
  int *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  int local_2d8;
  _Self local_2b0;
  _Base_ptr local_2a8;
  _Rb_tree_const_iterator<int> local_2a0 [7];
  _Base_ptr local_268;
  int local_25c;
  long local_258;
  undefined4 local_24c;
  TPZVec<int> local_248 [2];
  int local_1fc;
  _Base_ptr local_1f8;
  undefined1 local_1f0;
  undefined4 local_1e4;
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  int local_1cc;
  TPZGeoEl *local_1c8;
  TPZCompEl *local_1c0;
  TPZCompElSide local_1b8;
  long local_1a8;
  int64_t local_1a0;
  long local_198;
  TPZVec<TPZCompElSide> local_190 [6];
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  TPZGeoEl *local_a8;
  int local_a0;
  TPZCompEl *local_90;
  long local_88;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_50;
  long local_30;
  int64_t local_28;
  int local_1c;
  int local_18;
  int local_14;
  TPZVec<int> *local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_1c = TPZCompMesh::Dimension(*(TPZCompMesh **)(in_RDI + 8));
  local_28 = TPZCompMesh::NElements((TPZCompMesh *)0x201e3c8);
  local_30 = (local_28 / (long)local_14) / 0x14;
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::TPZVec
            ((TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffb30,CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
            );
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x201e419
            );
  for (local_88 = 0; local_88 < local_28; local_88 = local_88 + 1) {
    TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
    ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (in_stack_fffffffffffffb20,(int64_t)in_stack_fffffffffffffb18);
    pTVar3 = local_10;
    local_90 = *ppTVar6;
    if (local_90 != (TPZCompEl *)0x0) {
      iVar7 = TPZCompEl::Index(local_90);
      piVar8 = TPZVec<int>::operator[](pTVar3,iVar7);
      local_a0 = *piVar8;
      pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                          in_stack_fffffffffffffb38);
      *pmVar9 = *pmVar9 + 1;
      local_a8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb08);
      if (local_a8 != (TPZGeoEl *)0x0) {
        local_ac = (**(code **)(*(long *)local_a8 + 0xf0))();
        local_b0 = (**(code **)(*(long *)local_a8 + 0x210))();
        for (local_b4 = 0; local_b4 < local_ac; local_b4 = local_b4 + 1) {
          local_b8 = (**(code **)(*(long *)local_a8 + 0x208))(local_a8,local_b4);
          if (((local_b8 == local_18) || (local_b0 < local_18)) &&
             ((local_18 <= local_b0 || (local_b4 == local_ac + -1)))) {
            TPZGeoElSide::TPZGeoElSide
                      (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb04
                      );
            TPZStack<TPZCompElSide,_10>::TPZStack
                      ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffb10);
            TPZGeoElSide::ConnectedCompElementList
                      ((TPZGeoElSide *)in_stack_fffffffffffffb30,
                       (TPZStack<TPZCompElSide,_10> *)
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       (int)((ulong)in_stack_fffffffffffffb20 >> 0x20),
                       (int)in_stack_fffffffffffffb20);
            local_198 = TPZVec<TPZCompElSide>::NElements(local_190);
            local_1a8 = 0;
            for (local_1a0 = 0; local_1a0 < local_198; local_1a0 = local_1a0 + 1) {
              celside_00 = TPZVec<TPZCompElSide>::operator[](local_190,local_1a0);
              TPZCompElSide::TPZCompElSide(&local_1b8,celside_00);
              local_1c0 = TPZCompElSide::Element(&local_1b8);
              local_1c8 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffb08);
              iVar5 = (**(code **)(*(long *)local_1c8 + 0x210))();
              pTVar3 = local_10;
              if (iVar5 == local_1c) {
                local_1a8 = local_1a8 + 1;
                iVar7 = TPZCompEl::Index(local_1c0);
                piVar8 = TPZVec<int>::operator[](pTVar3,iVar7);
                local_1cc = *piVar8;
                if (local_1cc != local_a0) {
                  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::operator[]
                            (&local_50,(long)local_a0);
                  pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                      in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
                  local_1e0 = (_Base_ptr)pVar13.first._M_node;
                  local_1d8 = pVar13.second;
                }
              }
            }
            if (local_1a8 == 0) {
              TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::operator[]
                        (&local_50,(long)local_a0);
              local_1e4 = 0xffffffff;
              pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                  in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              local_1f8 = (_Base_ptr)pVar13.first._M_node;
              local_1f0 = pVar13.second;
            }
            TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x201e972);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x201e97f);
          }
        }
      }
    }
  }
  local_24c = 0xffffffff;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffffb30,CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
             ,(int *)in_stack_fffffffffffffb20);
  local_258 = 0;
  for (local_1fc = 0; local_1fc < local_14; local_1fc = local_1fc + 1) {
    TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::operator[]
              (&local_50,(long)local_1fc);
    sVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)0x201ea43);
    if (sVar10 == 1) {
      TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::operator[]
                (&local_50,(long)local_1fc);
      local_268 = (_Base_ptr)
                  std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                            (in_stack_fffffffffffffaf8);
      piVar11 = std::_Rb_tree_const_iterator<int>::operator*
                          ((_Rb_tree_const_iterator<int> *)0x201ea8e);
      local_25c = *piVar11;
      if (local_25c != -1) {
        piVar8 = TPZVec<int>::operator[](local_248,(long)local_25c);
        if ((*piVar8 == -1) &&
           (piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc), *piVar8 == -1)) {
          iVar5 = (int)local_258;
          piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc);
          *piVar8 = iVar5;
          iVar5 = (int)local_258;
          piVar8 = TPZVec<int>::operator[](local_248,(long)local_25c);
          *piVar8 = iVar5;
          local_258 = local_258 + 1;
        }
        else {
          piVar8 = TPZVec<int>::operator[](local_248,(long)local_25c);
          if (*piVar8 == -1) {
            piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc);
            iVar5 = *piVar8;
            piVar8 = TPZVec<int>::operator[](local_248,(long)local_25c);
            *piVar8 = iVar5;
          }
          else {
            piVar8 = TPZVec<int>::operator[](local_248,(long)local_25c);
            iVar5 = *piVar8;
            piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc);
            *piVar8 = iVar5;
          }
        }
      }
    }
    else {
      piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc);
      if ((*piVar8 == -1) &&
         (pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                              in_stack_fffffffffffffb38), *pmVar9 < local_30)) {
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   0x201ed1e);
        std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(local_2a0);
        TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::operator[]
                  (&local_50,(long)local_1fc);
        local_2a8 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffaf8);
        local_2a0[0]._M_node = local_2a8;
        while( true ) {
          TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::operator[]
                    (&local_50,(long)local_1fc);
          local_2b0._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffaf8);
          bVar4 = std::operator!=(local_2a0,&local_2b0);
          if (!bVar4) break;
          piVar11 = std::_Rb_tree_const_iterator<int>::operator*
                              ((_Rb_tree_const_iterator<int> *)0x201edce);
          if (*piVar11 != -1) {
            piVar11 = std::_Rb_tree_const_iterator<int>::operator*
                                ((_Rb_tree_const_iterator<int> *)0x201ede4);
            iVar5 = *piVar11;
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       in_stack_fffffffffffffb38);
            pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                                  in_stack_fffffffffffffb38);
            *pmVar9 = iVar5;
          }
          std::_Rb_tree_const_iterator<int>::operator++
                    ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffb08,
                     in_stack_fffffffffffffb04);
        }
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::rbegin
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   in_stack_fffffffffffffaf8);
        ppVar12 = std::reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>::
                  operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
        iVar5 = ppVar12->second;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            in_stack_fffffffffffffb38);
        iVar1 = *pmVar9;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            in_stack_fffffffffffffb38);
        iVar2 = *pmVar9;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            in_stack_fffffffffffffb38);
        *pmVar9 = iVar1 + iVar2;
        pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            in_stack_fffffffffffffb38);
        *pmVar9 = 0;
        piVar8 = TPZVec<int>::operator[](local_248,(long)iVar5);
        if (*piVar8 == -1) {
          iVar1 = (int)local_258;
          piVar8 = TPZVec<int>::operator[](local_248,(long)iVar5);
          *piVar8 = iVar1;
          iVar5 = (int)local_258;
          piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc);
          *piVar8 = iVar5;
          local_258 = local_258 + 1;
        }
        else {
          piVar8 = TPZVec<int>::operator[](local_248,(long)iVar5);
          in_stack_fffffffffffffb44 = *piVar8;
          piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc);
          *piVar8 = in_stack_fffffffffffffb44;
        }
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   0x201f09d);
      }
      else {
        in_stack_fffffffffffffb38 = TPZVec<int>::operator[](local_248,(long)local_1fc);
        if (*in_stack_fffffffffffffb38 == -1) {
          iVar5 = (int)local_258;
          local_258 = local_258 + 1;
          piVar8 = TPZVec<int>::operator[](local_248,(long)local_1fc);
          *piVar8 = iVar5;
        }
      }
    }
  }
  this_00 = (TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
            TPZVec<int>::NElements(local_10);
  iVar5 = (int)this_00;
  for (local_2d8 = 0; local_2d8 < iVar5; local_2d8 = local_2d8 + 1) {
    piVar8 = TPZVec<int>::operator[](local_10,(long)local_2d8);
    piVar8 = TPZVec<int>::operator[](local_248,(long)*piVar8);
    in_stack_fffffffffffffb04 = *piVar8;
    piVar8 = TPZVec<int>::operator[](local_10,(long)local_2d8);
    *piVar8 = in_stack_fffffffffffffb04;
  }
  iVar5 = (int)local_258;
  TPZManVector<int,_10>::~TPZManVector
            ((TPZManVector<int,_10> *)CONCAT44(in_stack_fffffffffffffb04,iVar5));
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x201f207
            );
  TPZVec<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~TPZVec(this_00);
  return iVar5;
}

Assistant:

int  TPZDohrStructMatrix<TVar,TPar>::ClusterIslands(TPZVec<int> &domain_index,int nsub,int connectdimension)
{
    int meshdim = this->fMesh->Dimension();
    int64_t nel = this->fMesh->NElements();
    int64_t mincount = nel/nsub/20;
    // contains for each subdomain the set of neighbouring domains
    TPZVec<std::set<int> > domain_neighbours(nsub);
    // contains for each domain the number of cells within that domain
    std::map<int,int> domain_index_count;
    int64_t iel;
    for (iel=0; iel<nel; iel++) {
        TPZCompEl *cel = this->fMesh->ElementVec()[iel];
        if (!cel) {
            continue;
        }
        int mydomainindex = domain_index[cel->Index()];
        //        if (mydomainindex == 0) {
        //            std::stringstream sout;
        //            cel->Print(sout);
        //            TPZGeoEl *gel = cel->Reference();
        //            if (gel) {
        //                gel->Print(sout);
        //            }
        //            LOGPZ_DEBUG(logger, sout.str())
        //        }
        domain_index_count[mydomainindex]++;
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int nsides = gel->NSides();
        int geldim = gel->Dimension();
        int is;
        for (is=0; is<nsides; is++) {
            int sidedim = gel->SideDimension(is);
            if (sidedim != connectdimension && geldim>=connectdimension) {
                continue;
            }
            if (geldim < connectdimension && is != nsides-1)
            {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZStack<TPZCompElSide> elsidevec;
            gelside.ConnectedCompElementList(elsidevec, 0, 0);
            int64_t nneigh = elsidevec.NElements();
            int64_t neigh;
            int64_t nneighvalid = 0;
            for (neigh = 0; neigh <nneigh; neigh++) {
                TPZCompElSide celside = elsidevec[neigh];
                TPZCompEl *celloc = celside.Element();
                TPZGeoEl *gelloc = celloc->Reference();
                if (gelloc->Dimension() != meshdim) {
                    continue;
                }
                nneighvalid++;
                int celdomain = domain_index[celloc->Index()];
                if (celdomain != mydomainindex)
                {
                    domain_neighbours[mydomainindex].insert(celdomain);
                }
            }
            if (nneighvalid == 0)
            {
                // include the boundary as a ficticious neighbour index
                domain_neighbours[mydomainindex].insert(-1);
            }
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        for (int64_t i=0; i<domain_neighbours.size(); i++) {
            std::set<int>::const_iterator it;
            sout << "Domain index " << i << " neighbours ";
            for (it=domain_neighbours[i].begin(); it != domain_neighbours[i].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        std::map<int,int>::const_iterator it = domain_index_count.begin();
        while (it != domain_index_count.end()) {
            sout << "Domain index " << it->first << " number of elements " << it->second << std::endl;
            it++;
        }
        LOGPZ_DEBUG(logger, sout.str())
        
    }
#endif
    // compute a destination domain index for each domain (used for clustering domains)
    int isub;
    TPZManVector<int> domain_dest(nsub,-1);
    int64_t count = 0;
    for (isub=0; isub < nsub; isub++)
    {
        // if the subdomain is neighbour to only one subdomain
        // this means that the subdomain is isolated (only boundaries as neighbours) (not treated)
        // or that the domain is embedded in another domain
        if (domain_neighbours[isub].size() == 1 )
        {
            // merge both subdomains
            int target = *(domain_neighbours[isub].begin());
            // target == -1 is not treated here
            if (target == -1) {
                continue;
            }
            if (domain_dest[target] == -1 && domain_dest[isub] == -1)
            {
                domain_dest[isub] = count;
                domain_dest[target] = count;
                count++;
            }
            else if (domain_dest[target] == -1)
            {
                domain_dest[target] = domain_dest[isub];
            }
            else
            {
                domain_dest[isub] = domain_dest[target];
            }
            
        }
        else if(domain_dest[isub] == -1 && domain_index_count[isub] < mincount)
        {
            // the domain has very little elements
            // the domain has at least two neighbouring domains (may include the ficticious -1 domain)
            std::map<int,int> sizeDomain;
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                if (*it != -1) {
                    sizeDomain[domain_index_count[isub]] = *it;
                }
            }
            int domaintargetindex = sizeDomain.rbegin()->second;
            int destdomainindexcount = domain_index_count[domaintargetindex];
            int domainshrinkcount = domain_index_count[isub];
            domain_index_count[domaintargetindex] = destdomainindexcount+domainshrinkcount;
            domain_index_count[isub] = 0;
            if(domain_dest[domaintargetindex] == -1)
            {
                domain_dest[domaintargetindex] = count;
                domain_dest[isub] = count;
                count++;
            }
            else {
                domain_dest[isub] = domain_dest[domaintargetindex];
            }
            
        }
        else if (domain_dest[isub] == -1)
        {
            domain_dest[isub] = count++;
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        int isub;
        for (isub=0; isub < nsub; isub++) {
            sout << "isub = " << isub << " number of neighbours " << domain_neighbours[isub].size() << " domains ";
            std::set<int>::iterator it;
            for (it = domain_neighbours[isub].begin(); it != domain_neighbours[isub].end(); it++) {
                sout << *it << " ";
            }
            sout << std::endl;
        }
        sout << "Destination domain " << domain_dest << std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    int domsize = domain_index.NElements();
    int d;
    for (d=0; d<domsize; d++) {
        domain_index[d] = domain_dest[domain_index[d]];
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Number of elements per domain ";
        std::map<int,int>::iterator it;
        int64_t count = 0;
        for (it=domain_index_count.begin(); it != domain_index_count.end(); it++) {
            if (! (count++ %40)) {
                sout << std::endl;
            }
            sout << it->first << " " << it->second << " ";
        }
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
    return count;
}